

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
insert_element_at(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  *this,int *key,int payload,int pos)

{
  bool bVar1;
  
  this->key_slots_[pos] = *key;
  this->payload_slots_[pos] = payload;
  set_bit(this,pos);
  while( true ) {
    if (pos < 1) {
      return;
    }
    bVar1 = check_exists(this,pos - 1);
    if (bVar1) break;
    pos = pos - 1;
    this->key_slots_[(uint)pos] = *key;
  }
  return;
}

Assistant:

void insert_element_at(const T& key, P payload, int pos) {
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_[pos] = key;
    payload_slots_[pos] = payload;
#else
    data_slots_[index] = std::make_pair(key, payload);
#endif
    set_bit(pos);

    // Overwrite preceding gaps until we reach the previous element
    pos--;
    while (pos >= 0 && !check_exists(pos)) {
      ALEX_DATA_NODE_KEY_AT(pos) = key;
      pos--;
    }
  }